

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_conf_psk
              (mbedtls_ssl_config *conf,uchar *psk,size_t psk_len,uchar *psk_identity,
              size_t psk_identity_len)

{
  int iVar1;
  int iVar2;
  uchar *__ptr;
  uchar *__dest;
  
  iVar1 = -0x7100;
  iVar2 = -0x7100;
  if ((((psk_identity_len < 0x4001) && (iVar2 = iVar1, psk_len < 0x21)) && (psk != (uchar *)0x0)) &&
     (psk_identity != (uchar *)0x0)) {
    if ((conf->psk != (uchar *)0x0) || (conf->psk_identity != (uchar *)0x0)) {
      free(conf->psk);
      free(conf->psk_identity);
    }
    __ptr = (uchar *)calloc(1,psk_len);
    conf->psk = __ptr;
    if (__ptr != (uchar *)0x0) {
      __dest = (uchar *)calloc(1,psk_identity_len);
      conf->psk_identity = __dest;
      if (__dest != (uchar *)0x0) {
        conf->psk_len = psk_len;
        conf->psk_identity_len = psk_identity_len;
        memcpy(__ptr,psk,psk_len);
        memcpy(__dest,psk_identity,psk_identity_len);
        return 0;
      }
    }
    free(__ptr);
    free(conf->psk_identity);
    conf->psk = (uchar *)0x0;
    conf->psk_identity = (uchar *)0x0;
    iVar2 = -0x7f00;
  }
  return iVar2;
}

Assistant:

int mbedtls_ssl_conf_psk( mbedtls_ssl_config *conf,
                const unsigned char *psk, size_t psk_len,
                const unsigned char *psk_identity, size_t psk_identity_len )
{
    if( psk == NULL || psk_identity == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    if( psk_len > MBEDTLS_PSK_MAX_LEN )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    /* Identity len will be encoded on two bytes */
    if( ( psk_identity_len >> 16 ) != 0 ||
        psk_identity_len > MBEDTLS_SSL_MAX_CONTENT_LEN )
    {
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    if( conf->psk != NULL || conf->psk_identity != NULL )
    {
        mbedtls_free( conf->psk );
        mbedtls_free( conf->psk_identity );
    }

    if( ( conf->psk = mbedtls_calloc( 1, psk_len ) ) == NULL ||
        ( conf->psk_identity = mbedtls_calloc( 1, psk_identity_len ) ) == NULL )
    {
        mbedtls_free( conf->psk );
        mbedtls_free( conf->psk_identity );
        conf->psk = NULL;
        conf->psk_identity = NULL;
        return( MBEDTLS_ERR_SSL_ALLOC_FAILED );
    }

    conf->psk_len = psk_len;
    conf->psk_identity_len = psk_identity_len;

    memcpy( conf->psk, psk, conf->psk_len );
    memcpy( conf->psk_identity, psk_identity, conf->psk_identity_len );

    return( 0 );
}